

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

size_t MyWrite(void *pp,void *data,size_t size)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  CSeqOutStreamBuf *p;
  undefined8 local_18;
  
  local_18 = in_RDX;
  if (*(ulong *)(in_RDI + 0x10) < in_RDX) {
    local_18 = *(size_t *)(in_RDI + 0x10);
    *(undefined4 *)(in_RDI + 0x18) = 1;
  }
  memcpy(*(void **)(in_RDI + 8),in_RSI,local_18);
  *(size_t *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - local_18;
  *(size_t *)(in_RDI + 8) = local_18 + *(long *)(in_RDI + 8);
  return local_18;
}

Assistant:

static size_t MyWrite(void *pp, const void *data, size_t size)
{
  CSeqOutStreamBuf *p = (CSeqOutStreamBuf *)pp;
  if (p->rem < size)
  {
    size = p->rem;
    p->overflow = True;
  }
  memcpy(p->data, data, size);
  p->rem -= size;
  p->data += size;
  return size;
}